

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_attributeValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = -4;
  if (ptr < end) {
    bVar5 = (long)end - (long)ptr < 0;
    if (end == ptr || bVar5) {
      return -1;
    }
    pbVar3 = (byte *)ptr;
    if (end != ptr && !bVar5) {
      do {
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar3)) {
        case 2:
          *nextTokPtr = (char *)pbVar3;
          return 0;
        case 3:
          if (pbVar3 == (byte *)ptr) {
            iVar1 = normal_scanRef(enc,(char *)(pbVar3 + 1),end,nextTokPtr);
            return iVar1;
          }
          goto LAB_00461c58;
        default:
          lVar4 = 1;
          break;
        case 5:
          lVar4 = 2;
          break;
        case 6:
          lVar4 = 3;
          break;
        case 7:
          lVar4 = 4;
          break;
        case 9:
          if (pbVar3 == (byte *)ptr) {
            pbVar2 = pbVar3 + 1;
            if ((byte *)end != pbVar2 && -1 < (long)end - (long)pbVar2) {
              if (*(char *)((long)enc[1].scanners + (ulong)pbVar3[1]) == '\n') {
                pbVar2 = pbVar3 + 2;
              }
              *nextTokPtr = (char *)pbVar2;
              return 7;
            }
            return -3;
          }
          goto LAB_00461c58;
        case 10:
          if (pbVar3 == (byte *)ptr) {
            *nextTokPtr = (char *)(pbVar3 + 1);
            return 7;
          }
          goto LAB_00461c58;
        case 0x15:
          if (pbVar3 == (byte *)ptr) {
            *nextTokPtr = (char *)(pbVar3 + 1);
            return 0x27;
          }
          goto LAB_00461c58;
        }
        pbVar3 = pbVar3 + lVar4;
      } while ((byte *)end != pbVar3 && -1 < (long)end - (long)pbVar3);
    }
LAB_00461c58:
    *nextTokPtr = (char *)pbVar3;
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

static int PTRCALL
PREFIX(attributeValueTok)(const ENCODING *enc, const char *ptr,
                          const char *end, const char **nextTokPtr)
{
  const char *start;
  if (ptr >= end)
    return XML_TOK_NONE;
  else if (! HAS_CHAR(enc, ptr, end)) {
    /* This line cannot be executed.  The incoming data has already
     * been tokenized once, so incomplete characters like this have
     * already been eliminated from the input.  Retaining the paranoia
     * check is still valuable, however.
     */
    return XML_TOK_PARTIAL; /* LCOV_EXCL_LINE */
  }
  start = ptr;
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: ptr += n; break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LT:
      /* this is for inside entity references */
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (! HAS_CHAR(enc, ptr, end))
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_S:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_ATTRIBUTE_VALUE_S;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}